

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

void gcm_mult(mbedtls_gcm_context *ctx,uchar *x,uchar *output)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uchar local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  uchar h [16];
  uint64_t zl;
  uint64_t zh;
  uchar rem;
  uchar hi;
  uchar lo;
  int i;
  uchar *output_local;
  uchar *x_local;
  mbedtls_gcm_context *ctx_local;
  
  iVar2 = mbedtls_aesni_has_support(2);
  if (iVar2 == 0) {
    zl = ctx->HH[x[0xf] & 0xf];
    h._8_8_ = ctx->HL[x[0xf] & 0xf];
    for (zh._4_4_ = 0xf; -1 < zh._4_4_; zh._4_4_ = zh._4_4_ + -1) {
      bVar1 = (byte)((int)(uint)x[zh._4_4_] >> 4);
      if (zh._4_4_ != 0xf) {
        uVar3 = zl << 0x3c;
        zl = ctx->HH[x[zh._4_4_] & 0xf] ^ last4[(byte)h._8_8_ & 0xf] << 0x30 ^ zl >> 4;
        h._8_8_ = ctx->HL[x[zh._4_4_] & 0xf] ^ (uVar3 | (ulong)h._8_8_ >> 4);
      }
      uVar3 = zl << 0x3c;
      zl = ctx->HH[bVar1] ^ last4[(byte)h._8_8_ & 0xf] << 0x30 ^ zl >> 4;
      h._8_8_ = ctx->HL[bVar1] ^ (uVar3 | (ulong)h._8_8_ >> 4);
    }
    *output = (uchar)(zl >> 0x38);
    output[1] = (uchar)(zl >> 0x30);
    output[2] = (uchar)(zl >> 0x28);
    output[3] = (uchar)(zl >> 0x20);
    output[4] = (uchar)(zl >> 0x18);
    output[5] = (uchar)(zl >> 0x10);
    output[6] = (uchar)(zl >> 8);
    output[7] = (uchar)zl;
    output[8] = SUB81(h._8_8_,7);
    output[9] = SUB81(h._8_8_,6);
    output[10] = SUB81(h._8_8_,5);
    output[0xb] = SUB81(h._8_8_,4);
    output[0xc] = SUB81(h._8_8_,3);
    output[0xd] = SUB81(h._8_8_,2);
    output[0xe] = SUB81(h._8_8_,1);
    output[0xf] = (byte)h._8_8_;
  }
  else {
    local_48 = (uchar)(ctx->HH[8] >> 0x38);
    local_47 = (undefined1)(ctx->HH[8] >> 0x30);
    local_46 = (undefined1)(ctx->HH[8] >> 0x28);
    local_45 = (undefined1)(ctx->HH[8] >> 0x20);
    local_44 = (undefined1)(ctx->HH[8] >> 0x18);
    local_43 = (undefined1)(ctx->HH[8] >> 0x10);
    local_42 = (undefined1)(ctx->HH[8] >> 8);
    local_41 = (undefined1)ctx->HH[8];
    h[0] = (uchar)(ctx->HL[8] >> 0x38);
    h[1] = (uchar)(ctx->HL[8] >> 0x30);
    h[2] = (uchar)(ctx->HL[8] >> 0x28);
    h[3] = (uchar)(ctx->HL[8] >> 0x20);
    h[4] = (uchar)(ctx->HL[8] >> 0x18);
    h[5] = (uchar)(ctx->HL[8] >> 0x10);
    h[6] = (uchar)(ctx->HL[8] >> 8);
    h[7] = (uchar)ctx->HL[8];
    mbedtls_aesni_gcm_mult(output,x,&local_48);
  }
  return;
}

Assistant:

static void gcm_mult( mbedtls_gcm_context *ctx, const unsigned char x[16],
                      unsigned char output[16] )
{
    int i = 0;
    unsigned char lo, hi, rem;
    uint64_t zh, zl;

#if defined(MBEDTLS_AESNI_C) && defined(MBEDTLS_HAVE_X86_64)
    if( mbedtls_aesni_has_support( MBEDTLS_AESNI_CLMUL ) ) {
        unsigned char h[16];

        PUT_UINT32_BE( ctx->HH[8] >> 32, h,  0 );
        PUT_UINT32_BE( ctx->HH[8],       h,  4 );
        PUT_UINT32_BE( ctx->HL[8] >> 32, h,  8 );
        PUT_UINT32_BE( ctx->HL[8],       h, 12 );

        mbedtls_aesni_gcm_mult( output, x, h );
        return;
    }
#endif /* MBEDTLS_AESNI_C && MBEDTLS_HAVE_X86_64 */

    lo = x[15] & 0xf;

    zh = ctx->HH[lo];
    zl = ctx->HL[lo];

    for( i = 15; i >= 0; i-- )
    {
        lo = x[i] & 0xf;
        hi = x[i] >> 4;

        if( i != 15 )
        {
            rem = (unsigned char) zl & 0xf;
            zl = ( zh << 60 ) | ( zl >> 4 );
            zh = ( zh >> 4 );
            zh ^= (uint64_t) last4[rem] << 48;
            zh ^= ctx->HH[lo];
            zl ^= ctx->HL[lo];

        }

        rem = (unsigned char) zl & 0xf;
        zl = ( zh << 60 ) | ( zl >> 4 );
        zh = ( zh >> 4 );
        zh ^= (uint64_t) last4[rem] << 48;
        zh ^= ctx->HH[hi];
        zl ^= ctx->HL[hi];
    }

    PUT_UINT32_BE( zh >> 32, output, 0 );
    PUT_UINT32_BE( zh, output, 4 );
    PUT_UINT32_BE( zl >> 32, output, 8 );
    PUT_UINT32_BE( zl, output, 12 );
}